

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

any * __thiscall
Omega_h::ExprOpsReader::at_reduce
          (any *__return_storage_ptr__,ExprOpsReader *this,int prod,
          vector<Omega_h::any,_std::allocator<Omega_h::any>_> *rhs)

{
  pointer *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> name_in;
  bool bVar1;
  char *file;
  SemicolonOp *pSVar2;
  AssignOp *this_01;
  TernaryOp *this_02;
  OrOp *this_03;
  AndOp *this_04;
  GtOp *this_05;
  LtOp *this_06;
  ParserFail *pPVar3;
  EqOp *this_07;
  AddOp *this_08;
  SubOp *this_09;
  MulOp *this_10;
  DivOp *this_11;
  PowOp *this_12;
  CallOp *this_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_14;
  NegOp *this_15;
  reference pvVar4;
  VarOp *this_16;
  shared_ptr<Omega_h::ExprOp> local_698;
  string *local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name_2;
  shared_ptr<Omega_h::ExprOp> local_678;
  shared_ptr<Omega_h::ExprOp> local_668;
  undefined1 local_658 [8];
  OpPtr rhs_op_12;
  vector<Omega_h::any,_std::allocator<Omega_h::any>_> *args_2;
  Args args_1;
  shared_ptr<Omega_h::ExprOp> local_610;
  Args *local_600;
  vector<Omega_h::any,_std::allocator<Omega_h::any>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name_1;
  shared_ptr<Omega_h::ExprOp> local_5e8;
  shared_ptr<Omega_h::ExprOp> local_5d8;
  shared_ptr<Omega_h::ExprOp> local_5c8;
  undefined1 local_5b8 [8];
  OpPtr rhs_op_11;
  OpPtr lhs_op_10;
  shared_ptr<Omega_h::ExprOp> local_590;
  shared_ptr<Omega_h::ExprOp> local_580;
  shared_ptr<Omega_h::ExprOp> local_570;
  undefined1 local_560 [8];
  OpPtr rhs_op_10;
  OpPtr lhs_op_9;
  shared_ptr<Omega_h::ExprOp> local_538;
  shared_ptr<Omega_h::ExprOp> local_528;
  shared_ptr<Omega_h::ExprOp> local_518;
  undefined1 local_508 [8];
  OpPtr rhs_op_9;
  OpPtr lhs_op_8;
  shared_ptr<Omega_h::ExprOp> local_4e0;
  shared_ptr<Omega_h::ExprOp> local_4d0;
  shared_ptr<Omega_h::ExprOp> local_4c0;
  undefined1 local_4b0 [8];
  OpPtr rhs_op_8;
  OpPtr lhs_op_7;
  shared_ptr<Omega_h::ExprOp> local_488;
  shared_ptr<Omega_h::ExprOp> local_478;
  shared_ptr<Omega_h::ExprOp> local_468;
  undefined1 local_458 [8];
  OpPtr rhs_op_7;
  OpPtr lhs_op_6;
  shared_ptr<Omega_h::ExprOp> local_430;
  shared_ptr<Omega_h::ExprOp> local_420;
  shared_ptr<Omega_h::ExprOp> local_410;
  undefined1 local_400 [8];
  OpPtr rhs_op_6;
  OpPtr lhs_op_5;
  string local_3d8 [39];
  undefined1 local_3b1;
  shared_ptr<Omega_h::ExprOp> local_3b0;
  shared_ptr<Omega_h::ExprOp> local_3a0;
  shared_ptr<Omega_h::ExprOp> local_390;
  undefined1 local_380 [8];
  OpPtr rhs_op_5;
  OpPtr lhs_op_4;
  shared_ptr<Omega_h::ExprOp> local_358;
  shared_ptr<Omega_h::ExprOp> local_348;
  shared_ptr<Omega_h::ExprOp> local_338;
  undefined1 local_328 [8];
  OpPtr rhs_op_4;
  OpPtr lhs_op_3;
  shared_ptr<Omega_h::ExprOp> local_300;
  shared_ptr<Omega_h::ExprOp> local_2f0;
  shared_ptr<Omega_h::ExprOp> local_2e0;
  undefined1 local_2d0 [8];
  OpPtr rhs_op_3;
  OpPtr lhs_op_2;
  shared_ptr<Omega_h::ExprOp> local_2a8;
  shared_ptr<Omega_h::ExprOp> local_298;
  shared_ptr<Omega_h::ExprOp> local_288;
  undefined1 local_278 [8];
  OpPtr rhs_op_2;
  OpPtr lhs_op_1;
  shared_ptr<Omega_h::ExprOp> local_250;
  shared_ptr<Omega_h::ExprOp> local_240;
  shared_ptr<Omega_h::ExprOp> local_230;
  shared_ptr<Omega_h::ExprOp> local_220;
  undefined1 local_210 [8];
  OpPtr rhs_op_1;
  OpPtr lhs_op;
  OpPtr cond_op;
  shared_ptr<Omega_h::ExprOp> local_1d8;
  shared_ptr<Omega_h::ExprOp> local_1c8;
  undefined1 local_1b8 [8];
  OpPtr rhs_op;
  string *name;
  shared_ptr<Omega_h::ExprOp> local_198;
  shared_ptr<Omega_h::ExprOp> local_188;
  shared_ptr<Omega_h::ExprOp> local_178;
  undefined1 local_168 [8];
  shared_ptr<Omega_h::ExprOp> op_rhs_1;
  shared_ptr<Omega_h::ExprOp> op_lhs_1;
  shared_ptr<Omega_h::ExprOp> local_140;
  shared_ptr<Omega_h::ExprOp> local_130;
  shared_ptr<Omega_h::ExprOp> local_120;
  undefined1 local_110 [8];
  shared_ptr<Omega_h::ExprOp> op_rhs;
  shared_ptr<Omega_h::ExprOp> op_lhs;
  string local_e8 [32];
  __cxx11 local_c8 [55];
  allocator local_91;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [39];
  ScopedTimer local_29;
  vector<Omega_h::any,_std::allocator<Omega_h::any>_> *pvStack_28;
  ScopedTimer omega_h_scoped_function_timer;
  vector<Omega_h::any,_std::allocator<Omega_h::any>_> *rhs_local;
  int prod_local;
  ExprOpsReader *this_local;
  
  pvStack_28 = rhs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp"
             ,&local_91);
  std::operator+(local_70,(char *)local_90);
  std::__cxx11::to_string(local_c8,0x406);
  std::operator+(local_50,local_70);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_29,"at_reduce",file);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  switch(prod) {
  case 0:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,1);
    bVar1 = any::empty(pvVar4);
    if (bVar1) {
      op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
           = 1;
      pPVar3 = (ParserFail *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e8,"Omega_h::ExprReader needs an expression to evaluate!",
                 (allocator *)
                 ((long)&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      ParserFail::ParserFail(pPVar3,(string *)local_e8);
      op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
           = 0;
      __cxa_throw(pPVar3,&ParserFail::typeinfo,ParserFail::~ParserFail);
    }
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    bVar1 = any::empty(pvVar4);
    if (bVar1) {
      pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,1);
      any::any(__return_storage_ptr__,pvVar4);
      op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 1;
    }
    else {
      pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
      any_cast<std::shared_ptr<Omega_h::ExprOp>>
                ((Omega_h *)
                 &op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,pvVar4);
      pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,1);
      any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_110,pvVar4);
      pSVar2 = (SemicolonOp *)operator_new(0x28);
      std::shared_ptr<Omega_h::ExprOp>::shared_ptr
                (&local_130,
                 (shared_ptr<Omega_h::ExprOp> *)
                 &op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::shared_ptr<Omega_h::ExprOp>::shared_ptr
                (&local_140,(shared_ptr<Omega_h::ExprOp> *)local_110);
      SemicolonOp::SemicolonOp(pSVar2,&local_130,&local_140);
      std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::SemicolonOp,void>(&local_120,pSVar2);
      any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_120);
      std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_120);
      std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_140);
      std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_130);
      op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 1;
      std::shared_ptr<Omega_h::ExprOp>::~shared_ptr((shared_ptr<Omega_h::ExprOp> *)local_110);
      std::shared_ptr<Omega_h::ExprOp>::~shared_ptr
                ((shared_ptr<Omega_h::ExprOp> *)
                 &op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    break;
  case 1:
  case 4:
    any::any(__return_storage_ptr__);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    break;
  case 2:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    bVar1 = any::empty(pvVar4);
    if (bVar1) {
      pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,1);
      any::any(__return_storage_ptr__,pvVar4);
      op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 1;
    }
    else {
      pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
      any_cast<std::shared_ptr<Omega_h::ExprOp>>
                ((Omega_h *)
                 &op_rhs_1.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,pvVar4);
      pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,1);
      any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_168,pvVar4);
      pSVar2 = (SemicolonOp *)operator_new(0x28);
      std::shared_ptr<Omega_h::ExprOp>::shared_ptr
                (&local_188,
                 (shared_ptr<Omega_h::ExprOp> *)
                 &op_rhs_1.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<Omega_h::ExprOp>::shared_ptr
                (&local_198,(shared_ptr<Omega_h::ExprOp> *)local_168);
      SemicolonOp::SemicolonOp(pSVar2,&local_188,&local_198);
      std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::SemicolonOp,void>(&local_178,pSVar2);
      any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_178);
      std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_178);
      std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_198);
      std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_188);
      op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 1;
      std::shared_ptr<Omega_h::ExprOp>::~shared_ptr((shared_ptr<Omega_h::ExprOp> *)local_168);
      std::shared_ptr<Omega_h::ExprOp>::~shared_ptr
                ((shared_ptr<Omega_h::ExprOp> *)
                 &op_rhs_1.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    break;
  case 3:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    rhs_op.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)any_cast<std::__cxx11::string&>(pvVar4);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,4);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_1b8,pvVar4);
    this_01 = (AssignOp *)operator_new(0x38);
    name_in = rhs_op.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_1d8,(shared_ptr<Omega_h::ExprOp> *)local_1b8);
    AssignOp::AssignOp(this_01,(string *)name_in._M_pi,&local_1d8);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::AssignOp,void>(&local_1c8,this_01);
    any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_1c8);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_1c8);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_1d8);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr((shared_ptr<Omega_h::ExprOp> *)local_1b8);
    break;
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0x1e:
  case 0x23:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    any::any(__return_storage_ptr__,pvVar4);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    break;
  case 0xe:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>
              ((Omega_h *)
               &lhs_op.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               pvVar4);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>
              ((Omega_h *)
               &rhs_op_1.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,pvVar4);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,6);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_210,pvVar4);
    this_02 = (TernaryOp *)operator_new(0x38);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_230,
               (shared_ptr<Omega_h::ExprOp> *)
               &lhs_op.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_240,
               (shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_1.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_250,(shared_ptr<Omega_h::ExprOp> *)local_210);
    TernaryOp::TernaryOp(this_02,&local_230,&local_240,&local_250);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::TernaryOp,void>(&local_220,this_02);
    any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_220);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_220);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_250);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_240);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_230);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr((shared_ptr<Omega_h::ExprOp> *)local_210);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr
              ((shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_1.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr
              ((shared_ptr<Omega_h::ExprOp> *)
               &lhs_op.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    break;
  case 0xf:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>
              ((Omega_h *)
               &rhs_op_2.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,pvVar4);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_278,pvVar4);
    this_03 = (OrOp *)operator_new(0x28);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_298,
               (shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_2.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_2a8,(shared_ptr<Omega_h::ExprOp> *)local_278);
    OrOp::OrOp(this_03,&local_298,&local_2a8);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::OrOp,void>(&local_288,this_03);
    any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_288);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_288);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_2a8);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_298);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr((shared_ptr<Omega_h::ExprOp> *)local_278);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr
              ((shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_2.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    break;
  case 0x10:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>
              ((Omega_h *)
               &rhs_op_3.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,pvVar4);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_2d0,pvVar4);
    this_04 = (AndOp *)operator_new(0x28);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_2f0,
               (shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_3.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_300,(shared_ptr<Omega_h::ExprOp> *)local_2d0);
    AndOp::AndOp(this_04,&local_2f0,&local_300);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::AndOp,void>(&local_2e0,this_04);
    any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_2e0);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_2e0);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_300);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_2f0);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr((shared_ptr<Omega_h::ExprOp> *)local_2d0);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr
              ((shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_3.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    break;
  case 0x11:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>
              ((Omega_h *)
               &rhs_op_4.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,pvVar4);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_328,pvVar4);
    this_05 = (GtOp *)operator_new(0x28);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_348,
               (shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_4.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_358,(shared_ptr<Omega_h::ExprOp> *)local_328);
    GtOp::GtOp(this_05,&local_348,&local_358);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::GtOp,void>(&local_338,this_05);
    any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_338);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_338);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_358);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_348);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr((shared_ptr<Omega_h::ExprOp> *)local_328);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr
              ((shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_4.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    break;
  case 0x12:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>
              ((Omega_h *)
               &rhs_op_5.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,pvVar4);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_380,pvVar4);
    this_06 = (LtOp *)operator_new(0x28);
    local_3b1 = 1;
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_3a0,
               (shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_5.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_3b0,(shared_ptr<Omega_h::ExprOp> *)local_380);
    LtOp::LtOp(this_06,&local_3a0,&local_3b0);
    local_3b1 = 0;
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::LtOp,void>(&local_390,this_06);
    any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_390);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_390);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_3b0);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_3a0);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr((shared_ptr<Omega_h::ExprOp> *)local_380);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr
              ((shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_5.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    break;
  case 0x13:
  case 0x14:
    lhs_op_5.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
         = 1;
    pPVar3 = (ParserFail *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_3d8,"Operators <= and >= not supported yet",
               (allocator *)
               ((long)&lhs_op_5.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    ParserFail::ParserFail(pPVar3,(string *)local_3d8);
    lhs_op_5.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
         = 0;
    __cxa_throw(pPVar3,&ParserFail::typeinfo,ParserFail::~ParserFail);
  case 0x15:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>
              ((Omega_h *)
               &rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,pvVar4);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_400,pvVar4);
    this_07 = (EqOp *)operator_new(0x28);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_420,
               (shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_430,(shared_ptr<Omega_h::ExprOp> *)local_400);
    EqOp::EqOp(this_07,&local_420,&local_430);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::EqOp,void>(&local_410,this_07);
    any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_410);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_410);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_430);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_420);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr((shared_ptr<Omega_h::ExprOp> *)local_400);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr
              ((shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    break;
  case 0x16:
  case 0x22:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,2);
    any::any(__return_storage_ptr__,pvVar4);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    break;
  case 0x17:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>
              ((Omega_h *)
               &rhs_op_7.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,pvVar4);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_458,pvVar4);
    this_08 = (AddOp *)operator_new(0x28);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_478,
               (shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_7.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_488,(shared_ptr<Omega_h::ExprOp> *)local_458);
    AddOp::AddOp(this_08,&local_478,&local_488);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::AddOp,void>(&local_468,this_08);
    any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_468);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_468);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_488);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_478);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr((shared_ptr<Omega_h::ExprOp> *)local_458);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr
              ((shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_7.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    break;
  case 0x18:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>
              ((Omega_h *)
               &rhs_op_8.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,pvVar4);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_4b0,pvVar4);
    this_09 = (SubOp *)operator_new(0x28);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_4d0,
               (shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_8.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_4e0,(shared_ptr<Omega_h::ExprOp> *)local_4b0);
    SubOp::SubOp(this_09,&local_4d0,&local_4e0);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::SubOp,void>(&local_4c0,this_09);
    any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_4c0);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_4c0);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_4e0);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_4d0);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr((shared_ptr<Omega_h::ExprOp> *)local_4b0);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr
              ((shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_8.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    break;
  case 0x19:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>
              ((Omega_h *)
               &rhs_op_9.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,pvVar4);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_508,pvVar4);
    this_10 = (MulOp *)operator_new(0x28);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_528,
               (shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_9.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_538,(shared_ptr<Omega_h::ExprOp> *)local_508);
    MulOp::MulOp(this_10,&local_528,&local_538);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::MulOp,void>(&local_518,this_10);
    any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_518);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_518);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_538);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_528);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr((shared_ptr<Omega_h::ExprOp> *)local_508);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr
              ((shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_9.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    break;
  case 0x1a:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>
              ((Omega_h *)
               &rhs_op_10.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,pvVar4);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_560,pvVar4);
    this_11 = (DivOp *)operator_new(0x28);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_580,
               (shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_10.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_590,(shared_ptr<Omega_h::ExprOp> *)local_560);
    DivOp::DivOp(this_11,&local_580,&local_590);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::DivOp,void>(&local_570,this_11);
    any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_570);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_570);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_590);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_580);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr((shared_ptr<Omega_h::ExprOp> *)local_560);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr
              ((shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_10.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    break;
  case 0x1b:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>
              ((Omega_h *)
               &rhs_op_11.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,pvVar4);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_5b8,pvVar4);
    this_12 = (PowOp *)operator_new(0x28);
    name_1._7_1_ = 1;
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_5d8,
               (shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_11.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_5e8,(shared_ptr<Omega_h::ExprOp> *)local_5b8);
    PowOp::PowOp(this_12,&local_5d8,&local_5e8);
    name_1._7_1_ = 0;
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::PowOp,void>(&local_5c8,this_12);
    any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_5c8);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_5c8);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_5e8);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_5d8);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr((shared_ptr<Omega_h::ExprOp> *)local_5b8);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr
              ((shared_ptr<Omega_h::ExprOp> *)
               &rhs_op_11.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    break;
  case 0x1c:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    args = (vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)
           any_cast<std::__cxx11::string&>(pvVar4);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,4);
    local_600 = any_cast<std::vector<Omega_h::any,std::allocator<Omega_h::any>>&>(pvVar4);
    this_13 = (CallOp *)operator_new(0x58);
    CallOp::CallOp(this_13,(string *)args,local_600);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::CallOp,void>(&local_610,this_13);
    any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_610);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_610);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    break;
  case 0x1d:
    args_1.super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = &args_1.super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::vector
              ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)this_00);
    any::any<std::vector<Omega_h::any,std::allocator<Omega_h::any>>,void>
              (__return_storage_ptr__,(vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)this_00
              );
    std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::~vector
              ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)
               &args_1.super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    break;
  case 0x1f:
    std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::vector
              ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)&args_2);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::push_back
              ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)&args_2,pvVar4);
    any::any<std::vector<Omega_h::any,std::allocator<Omega_h::any>>,void>
              (__return_storage_ptr__,(vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)&args_2
              );
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::~vector
              ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)&args_2);
    break;
  case 0x20:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    this_14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              any_cast<std::vector<Omega_h::any,std::allocator<Omega_h::any>>&>(pvVar4);
    rhs_op_12.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_14;
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,3);
    std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::push_back
              ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)this_14,pvVar4);
    any::any<std::vector<Omega_h::any,std::allocator<Omega_h::any>>,void>
              (__return_storage_ptr__,
               (vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)
               rhs_op_12.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    break;
  case 0x21:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,2);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_658,pvVar4);
    this_15 = (NegOp *)operator_new(0x18);
    name_2._7_1_ = 1;
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr
              (&local_678,(shared_ptr<Omega_h::ExprOp> *)local_658);
    NegOp::NegOp(this_15,&local_678);
    name_2._7_1_ = 0;
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::NegOp,void>(&local_668,this_15);
    any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_668);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_668);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_678);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr((shared_ptr<Omega_h::ExprOp> *)local_658);
    break;
  case 0x24:
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(pvStack_28,0);
    local_688 = any_cast<std::__cxx11::string&>(pvVar4);
    this_16 = (VarOp *)operator_new(0x28);
    VarOp::VarOp(this_16,local_688);
    std::shared_ptr<Omega_h::ExprOp>::shared_ptr<Omega_h::VarOp,void>(&local_698,this_16);
    any::any<std::shared_ptr<Omega_h::ExprOp>,void>(__return_storage_ptr__,&local_698);
    std::shared_ptr<Omega_h::ExprOp>::~shared_ptr(&local_698);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
    break;
  default:
    any::any(__return_storage_ptr__);
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
  }
  ScopedTimer::~ScopedTimer(&local_29);
  return __return_storage_ptr__;
}

Assistant:

any ExprOpsReader::at_reduce(int prod, std::vector<any>& rhs) {
  OMEGA_H_TIME_FUNCTION;
  using std::swap;
  switch (prod) {
    case math_lang::PROD_PROGRAM: {
      if (rhs.at(1).empty()) {
        throw ParserFail(
            "Omega_h::ExprReader needs an expression to evaluate!");
      }
      if (rhs.at(0).empty()) {
        return any(std::move(rhs.at(1)));
      } else {
        auto op_lhs = any_cast<OpPtr>(rhs.at(0));
        auto op_rhs = any_cast<OpPtr>(rhs.at(1));
        return OpPtr(new SemicolonOp(op_lhs, op_rhs));
      }
    }
    case math_lang::PROD_NO_STATEMENTS:
    case math_lang::PROD_NO_EXPR: {
      return any();
    }
    case math_lang::PROD_NEXT_STATEMENT: {
      if (rhs.at(0).empty()) {
        return any(std::move(rhs.at(1)));
      } else {
        auto op_lhs = any_cast<OpPtr>(rhs.at(0));
        auto op_rhs = any_cast<OpPtr>(rhs.at(1));
        return OpPtr(new SemicolonOp(op_lhs, op_rhs));
      }
    }
    case math_lang::PROD_ASSIGN: {
      std::string const& name = any_cast<std::string&>(rhs.at(0));
      OpPtr rhs_op = any_cast<OpPtr>(rhs.at(4));
      return OpPtr(new AssignOp(name, rhs_op));
    }
    case math_lang::PROD_YES_EXPR:
    case math_lang::PROD_EXPR:
    case math_lang::PROD_TERNARY_DECAY:
    case math_lang::PROD_OR_DECAY:
    case math_lang::PROD_AND_DECAY:
    case math_lang::PROD_ADD_SUB_DECAY:
    case math_lang::PROD_MUL_DIV_DECAY:
    case math_lang::PROD_POW_DECAY:
    case math_lang::PROD_NEG_DECAY:
    case math_lang::PROD_SOME_ARGS:
    case math_lang::PROD_CONST:
      return any(std::move(rhs.at(0)));
    case math_lang::PROD_TERNARY: {
      OpPtr cond_op = any_cast<OpPtr>(rhs.at(0));
      OpPtr lhs_op = any_cast<OpPtr>(rhs.at(3));
      OpPtr rhs_op = any_cast<OpPtr>(rhs.at(6));
      return OpPtr(new TernaryOp(cond_op, lhs_op, rhs_op));
    }
    case math_lang::PROD_OR:
      OMEGA_H_BINARY_REDUCE(OrOp)
    case math_lang::PROD_AND:
      OMEGA_H_BINARY_REDUCE(AndOp)
    case math_lang::PROD_GT:
      OMEGA_H_BINARY_REDUCE(GtOp)
    case math_lang::PROD_LT:
      OMEGA_H_BINARY_REDUCE(LtOp)
    case math_lang::PROD_GEQ:
    case math_lang::PROD_LEQ:
      throw ParserFail("Operators <= and >= not supported yet");
    case math_lang::PROD_EQ:
      OMEGA_H_BINARY_REDUCE(EqOp)
    case math_lang::PROD_ADD:
      OMEGA_H_BINARY_REDUCE(AddOp)
    case math_lang::PROD_SUB:
      OMEGA_H_BINARY_REDUCE(SubOp)
    case math_lang::PROD_MUL:
      OMEGA_H_BINARY_REDUCE(MulOp)
    case math_lang::PROD_DIV:
      OMEGA_H_BINARY_REDUCE(DivOp)
    case math_lang::PROD_POW:
      OMEGA_H_BINARY_REDUCE(PowOp)
    case math_lang::PROD_CALL: {
      auto& name = any_cast<std::string&>(rhs.at(0));
      auto& args = any_cast<ExprEnv::Args&>(rhs.at(4));
      return OpPtr(new CallOp(name, args));
    }
    case math_lang::PROD_NO_ARGS:
      return ExprEnv::Args{};
    case math_lang::PROD_FIRST_ARG: {
      ExprEnv::Args args;
      args.push_back(std::move(rhs.at(0)));
      return any(std::move(args));
    }
    case math_lang::PROD_NEXT_ARG: {
      auto& args = any_cast<ExprEnv::Args&>(rhs.at(0));
      args.push_back(std::move(rhs.at(3)));
      return any(std::move(args));
    }
    case math_lang::PROD_NEG: {
      OpPtr rhs_op = any_cast<OpPtr>(rhs.at(2));
      return OpPtr(new NegOp(rhs_op));
    }
    case math_lang::PROD_VAL_PARENS:
    case math_lang::PROD_BOOL_PARENS:
      return any(std::move(rhs.at(2)));
    case math_lang::PROD_VAR: {
      auto& name = any_cast<std::string&>(rhs.at(0));
      return OpPtr(new VarOp(name));
    }
  }
  return any();
}